

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.c
# Opt level: O3

logical pnga_overlay(Integer g_a,Integer g_parent)

{
  long lVar1;
  short sVar2;
  int iVar3;
  long lVar4;
  C_Integer *pCVar5;
  Integer IVar6;
  ulong uVar7;
  Integer IVar8;
  global_array_t *pgVar9;
  logical lVar10;
  ulong uVar11;
  Integer *pIVar12;
  int iVar13;
  long lVar14;
  long grp_id;
  C_Integer CVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  long lVar21;
  long lVar22;
  long lVar23;
  Integer _ndim_1;
  ulong ndims;
  long lVar24;
  long lVar25;
  bool bVar26;
  Integer _ndim;
  Integer hi [7];
  Integer dims [7];
  Integer blk [7];
  Integer chunk [7];
  Integer pe [7];
  Integer width [7];
  Integer local_1e0;
  ulong local_1d0;
  Integer local_1c8;
  ulong local_1c0;
  Integer local_1b8;
  long local_1b0;
  long local_1a8 [8];
  Integer local_168 [8];
  Integer local_128 [8];
  undefined8 local_e8;
  Integer local_a8 [8];
  long local_68 [7];
  
  lVar1 = g_a + 1000;
  local_1c8 = GAme;
  local_1e0 = GAnproc;
  _ga_sync_begin = 1;
  _ga_sync_end = 1;
  if (GA[lVar1].ndim == -1) {
    pnga_error("Insufficient data to create global array",0);
  }
  iVar3 = GA_Default_Proc_Group;
  iVar13 = GA[lVar1].p_handle;
  if (GA[lVar1].p_handle == GA_Init_Proc_Group) {
    GA[lVar1].p_handle = GA_Default_Proc_Group;
    iVar13 = iVar3;
  }
  grp_id = (long)iVar13;
  pnga_pgroup_sync(grp_id);
  local_1b0 = (g_parent + 1000) * 0x368;
  if (iVar13 != GA[g_parent + 1000].p_handle) {
    pnga_error("Parent and overlay global array must be on same procesor group",0);
  }
  if (0 < iVar13) {
    local_1e0 = (Integer)PGRP_LIST[grp_id].map_nproc;
    local_1c8 = (Integer)PGRP_LIST[grp_id].map_proc_list[GAme];
  }
  if (GAinitialized == '\0') {
    pnga_error("GA not initialized ",0);
  }
  if (ma_address_init == '\0') {
    gai_ma_address_init();
  }
  pgVar9 = GA;
  sVar2 = GA[lVar1].ndim;
  ndims = (ulong)sVar2;
  if (0 < (long)ndims) {
    memcpy(local_68,GA[g_a + 1000].width,ndims * 8);
  }
  pCVar5 = pgVar9[lVar1].mapc;
  if (pgVar9[lVar1].distr_type == 0 && pCVar5 == (C_Integer *)0x0) {
    if (0 < sVar2) {
      uVar11 = 0;
      do {
        local_168[uVar11] = pgVar9[g_a + 1000].dims[uVar11];
        (&local_e8)[uVar11] = pgVar9[g_a + 1000].chunk[uVar11];
        uVar11 = uVar11 + 1;
      } while (ndims != uVar11);
      if (CONCAT44(local_e8._4_4_,(undefined4)local_e8) == 0) {
        if (0 < sVar2) {
          memset(local_128,0xff,ndims * 8);
LAB_00170cef:
          uVar11 = 0;
          do {
            if (local_168[uVar11] == 1) {
              local_128[uVar11] = 1;
            }
            uVar11 = uVar11 + 1;
          } while (ndims != uVar11);
        }
      }
      else if (0 < sVar2) {
        uVar11 = 0;
        do {
          lVar24 = local_168[uVar11];
          if ((long)(&local_e8)[uVar11] < local_168[uVar11]) {
            lVar24 = (&local_e8)[uVar11];
          }
          local_128[uVar11] = lVar24;
          uVar11 = uVar11 + 1;
        } while (ndims != uVar11);
        if (0 < sVar2) goto LAB_00170cef;
      }
    }
    pnga_pgroup_sync(grp_id);
    if (iVar13 == 0) {
      lVar24 = (long)PGRP_LIST->map_nproc;
    }
    else {
      lVar24 = GA[lVar1].num_rstrctd;
      if (GA[lVar1].num_rstrctd == 0) {
        lVar24 = local_1e0;
      }
    }
    ddb_h2(ndims,local_168,lVar24,0.0,0,local_128,local_a8);
    if (sVar2 < 1) {
LAB_00170eab:
      lVar24 = 0;
      pgVar9 = GA;
    }
    else {
      uVar11 = 0;
      pIVar12 = mapALL;
      do {
        lVar24 = (&local_e8)[uVar11];
        lVar17 = local_168[uVar11];
        if (lVar24 < 2) {
          lVar22 = local_a8[uVar11];
          lVar17 = lVar17 - (local_128[uVar11] + -1) * lVar22;
        }
        else {
          lVar14 = lVar17;
          if (lVar24 < lVar17) {
            lVar14 = lVar24;
          }
          lVar22 = local_a8[uVar11];
          lVar17 = (1 - local_128[uVar11]) * lVar22 + (lVar17 + -1) / lVar14 + 1;
        }
        if ((lVar22 < 1) || (local_168[uVar11] < 1)) {
          lVar14 = 0;
        }
        else {
          lVar4 = 0;
          lVar19 = 0;
          do {
            lVar21 = local_128[uVar11] - (ulong)(lVar17 <= lVar4);
            pIVar12[lVar4] = lVar19 + 1;
            if (1 < lVar24) {
              lVar22 = local_168[uVar11];
              if (lVar24 < local_168[uVar11]) {
                lVar22 = lVar24;
              }
              lVar21 = lVar21 * lVar22;
            }
            lVar14 = lVar4 + 1;
            lVar22 = local_a8[uVar11];
            if (lVar22 <= lVar14) break;
            lVar19 = lVar19 + lVar21;
            lVar4 = lVar4 + 1;
          } while (lVar19 < local_168[uVar11]);
        }
        pgVar9 = GA;
        if (lVar22 < lVar14) {
          lVar14 = lVar22;
        }
        local_a8[uVar11] = lVar14;
        pIVar12 = pIVar12 + lVar14;
        uVar11 = uVar11 + 1;
      } while (uVar11 != ndims);
      if (sVar2 < 1) goto LAB_00170eab;
      uVar11 = 0;
      lVar24 = 0;
      do {
        lVar17 = local_a8[uVar11];
        pgVar9[g_a + 1000].nblock[uVar11] = (int)lVar17;
        lVar24 = lVar24 + lVar17;
        uVar11 = uVar11 + 1;
      } while (ndims != uVar11);
    }
    pCVar5 = (C_Integer *)malloc(lVar24 * 8 + 8);
    pgVar9[lVar1].mapc = pCVar5;
    pIVar12 = mapALL;
    pgVar9 = GA;
    if (lVar24 < 1) {
      pCVar5 = GA[lVar1].mapc;
    }
    else {
      pCVar5 = GA[lVar1].mapc;
      lVar17 = 0;
      do {
        pCVar5[lVar17] = pIVar12[lVar17];
        lVar17 = lVar17 + 1;
      } while (lVar24 != lVar17);
    }
    pCVar5[lVar24] = -1;
    lVar24 = 0;
  }
  else {
    switch(pgVar9[lVar1].distr_type) {
    case 1:
      lVar17 = pgVar9[lVar1].block_total;
      if (GAme < lVar17) {
        lVar22 = pgVar9[lVar1].num_blocks[0];
        lVar24 = 0;
        IVar8 = GAme;
        do {
          lVar14 = (long)(int)IVar8 % lVar22;
          local_e8._0_4_ = (int)lVar14;
          if (1 < sVar2) {
            lVar21 = 0;
            lVar19 = IVar8;
            lVar4 = lVar22;
            do {
              lVar19 = (long)((int)lVar19 - (int)lVar14) / lVar4;
              lVar4 = pgVar9[g_a + 1000].num_blocks[lVar21 + 1];
              lVar14 = (long)(int)lVar19 % lVar4;
              *(int *)((long)&local_e8 + lVar21 * 4 + 4) = (int)lVar14;
              lVar21 = lVar21 + 1;
            } while ((ndims & 0xffffffff) - 1 != lVar21);
          }
          if (sVar2 < 1) {
            lVar14 = 1;
          }
          else {
            lVar14 = 0;
            do {
              iVar3 = *(int *)((long)&local_e8 + lVar14);
              lVar4 = *(long *)((long)pgVar9[g_a + 1000].block_dims + lVar14 * 2);
              *(long *)((long)local_168 + lVar14 * 2) = lVar4 * iVar3 + 1;
              lVar4 = ((long)iVar3 + 1) * lVar4;
              lVar19 = *(long *)((long)pgVar9[g_a + 1000].dims + lVar14 * 2);
              if (lVar19 <= lVar4) {
                lVar4 = lVar19;
              }
              *(long *)((long)local_1a8 + lVar14 * 2) = lVar4;
              lVar14 = lVar14 + 4;
            } while ((ndims & 0xffffffff) << 2 != lVar14);
            lVar14 = 1;
            if (0 < sVar2) {
              uVar11 = 0;
              do {
                lVar14 = lVar14 * ((local_1a8[uVar11] - local_168[uVar11]) + 1);
                uVar11 = uVar11 + 1;
              } while (ndims != uVar11);
            }
          }
          lVar24 = lVar24 + lVar14;
          IVar8 = IVar8 + GAnproc;
          local_1c0 = ndims;
          local_1b8 = g_a;
        } while (IVar8 < lVar17);
      }
      else {
        lVar24 = 0;
        local_1c0 = ndims;
        local_1b8 = g_a;
      }
      break;
    case 2:
      lVar17 = (long)pgVar9[lVar1].nblock[0];
      lVar24 = GAme % lVar17;
      local_1a8[0] = lVar24;
      if (1 < sVar2) {
        lVar22 = 0;
        IVar8 = GAme;
        do {
          IVar8 = (IVar8 - lVar24) / (long)(int)lVar17;
          lVar17 = (long)pgVar9[g_a + 1000].nblock[lVar22 + 1];
          lVar24 = IVar8 % lVar17;
          local_1a8[lVar22 + 1] = lVar24;
          lVar22 = lVar22 + 1;
        } while (ndims - 1 != lVar22);
      }
      lVar24 = 1;
      local_1c0 = ndims;
      local_1b8 = g_a;
      if (0 < sVar2) {
        uVar11 = 0;
        do {
          lVar17 = local_1a8[uVar11];
          if (lVar17 < pgVar9[lVar1].num_blocks[uVar11]) {
            lVar18 = (long)pgVar9[lVar1].nblock[uVar11];
            lVar14 = pgVar9[lVar1].dims[uVar11];
            lVar4 = pgVar9[lVar1].block_dims[uVar11];
            lVar23 = lVar4 * (lVar17 + 1);
            lVar22 = ((lVar17 + 1) - lVar18) * lVar4;
            lVar20 = lVar4 * lVar18;
            lVar21 = (lVar18 - lVar17) * lVar4;
            lVar19 = 0;
            do {
              lVar16 = lVar19;
              lVar25 = lVar4 * lVar17;
              lVar19 = lVar14;
              if (lVar23 < lVar14) {
                lVar19 = lVar23;
              }
              lVar17 = lVar17 + lVar18;
              lVar22 = lVar22 + lVar20;
              lVar21 = lVar21 - lVar20;
              lVar23 = lVar23 + lVar20;
              lVar19 = (lVar16 - lVar25) + lVar19;
            } while (lVar17 < pgVar9[lVar1].num_blocks[uVar11]);
            if (lVar14 < lVar22) {
              lVar22 = lVar14;
            }
            lVar22 = lVar21 + lVar16 + lVar22;
          }
          else {
            lVar22 = 0;
          }
          lVar24 = lVar24 * lVar22;
          uVar11 = uVar11 + 1;
        } while (uVar11 != ndims);
      }
      break;
    case 3:
      lVar17 = (long)pgVar9[lVar1].nblock[0];
      lVar24 = GAme % lVar17;
      local_1a8[0] = lVar24;
      if (1 < sVar2) {
        lVar22 = 0;
        IVar8 = GAme;
        do {
          IVar8 = (IVar8 - lVar24) / (long)(int)lVar17;
          lVar17 = (long)pgVar9[g_a + 1000].nblock[lVar22 + 1];
          lVar24 = IVar8 % lVar17;
          local_1a8[lVar22 + 1] = lVar24;
          lVar22 = lVar22 + 1;
        } while (ndims - 1 != lVar22);
      }
      lVar24 = 1;
      local_1c0 = ndims;
      local_1b8 = g_a;
      if (0 < sVar2) {
        uVar11 = 0;
        do {
          lVar17 = local_1a8[uVar11];
          if (lVar17 < pgVar9[lVar1].num_blocks[uVar11]) {
            lVar20 = (long)pgVar9[lVar1].nblock[uVar11];
            lVar14 = pgVar9[lVar1].dims[uVar11];
            lVar4 = pgVar9[lVar1].block_dims[uVar11];
            lVar23 = lVar4 * (lVar17 + 1);
            lVar22 = ((lVar17 + 1) - lVar20) * lVar4;
            lVar21 = lVar4 * lVar20;
            lVar18 = (lVar20 - lVar17) * lVar4;
            lVar19 = 0;
            do {
              lVar16 = lVar19;
              lVar25 = lVar4 * lVar17;
              lVar19 = lVar14;
              if (lVar23 < lVar14) {
                lVar19 = lVar23;
              }
              lVar17 = lVar17 + lVar20;
              lVar22 = lVar22 + lVar21;
              lVar18 = lVar18 - lVar21;
              lVar23 = lVar23 + lVar21;
              lVar19 = (lVar16 - lVar25) + lVar19;
            } while (lVar17 < pgVar9[lVar1].num_blocks[uVar11]);
            if (lVar14 < lVar22) {
              lVar22 = lVar14;
            }
            lVar22 = lVar18 + lVar16 + lVar22;
          }
          else {
            lVar22 = 0;
          }
          lVar24 = lVar24 * lVar22;
          uVar11 = uVar11 + 1;
        } while (uVar11 != ndims);
      }
      break;
    case 4:
      lVar17 = (long)pgVar9[lVar1].nblock[0];
      lVar24 = GAme % lVar17;
      local_1a8[0] = lVar24;
      if (1 < sVar2) {
        lVar22 = 0;
        IVar8 = GAme;
        do {
          IVar8 = (IVar8 - lVar24) / (long)(int)lVar17;
          lVar17 = (long)pgVar9[g_a + 1000].nblock[lVar22 + 1];
          lVar24 = IVar8 % lVar17;
          local_1a8[lVar22 + 1] = lVar24;
          lVar22 = lVar22 + 1;
        } while (ndims - 1 != lVar22);
      }
      if (sVar2 < 1) {
        lVar24 = 1;
        local_1c0 = ndims;
        local_1b8 = g_a;
      }
      else {
        lVar24 = 1;
        lVar17 = 0;
        uVar11 = 0;
        do {
          lVar22 = local_1a8[uVar11];
          lVar14 = pgVar9[lVar1].num_blocks[uVar11];
          if (lVar22 < lVar14) {
            lVar4 = 0;
            do {
              if (lVar22 < lVar14 + -1) {
                CVar15 = pCVar5[lVar17 + lVar22 + 1] + -1;
              }
              else {
                CVar15 = pgVar9[lVar1].dims[uVar11];
              }
              lVar4 = (lVar4 - pCVar5[lVar17 + lVar22]) + CVar15 + 1;
              lVar22 = lVar22 + pgVar9[lVar1].nblock[uVar11];
            } while (lVar22 < lVar14);
          }
          else {
            lVar4 = 0;
          }
          lVar24 = lVar24 * lVar4;
          lVar17 = lVar17 + lVar14;
          uVar11 = uVar11 + 1;
          local_1c0 = ndims;
          local_1b8 = g_a;
        } while (uVar11 != ndims);
      }
      break;
    default:
      lVar24 = 0;
    }
  }
  GAstat.numcre = GAstat.numcre + 1;
  pgVar9[lVar1].actv = 1;
  IVar6 = pnga_cluster_nnodes();
  IVar8 = local_1c8;
  pgVar9 = GA;
  if ((IVar6 == 1) && (GA[lVar1].p_handle == 0)) {
    GA[lVar1].p_handle = -1;
  }
  if (pgVar9[lVar1].distr_type != 0) {
    lVar24 = lVar24 * pgVar9[lVar1].elemsize;
    if (0 < sVar2) {
      uVar11 = 0;
      do {
        pgVar9[lVar1].scale[uVar11] =
             (double)pgVar9[lVar1].num_blocks[uVar11] / (double)pgVar9[lVar1].dims[uVar11];
        uVar11 = uVar11 + 1;
      } while (ndims != uVar11);
    }
    goto LAB_00171438;
  }
  if (sVar2 < 1) {
    uVar11 = 0;
  }
  else {
    uVar7 = 0;
    do {
      pgVar9[g_a + 1000].scale[uVar7] =
           (double)pgVar9[g_a + 1000].nblock[uVar7] / (double)pgVar9[g_a + 1000].dims[uVar7];
      uVar7 = uVar7 + 1;
      uVar11 = ndims;
    } while (ndims != uVar7);
  }
  pnga_set_ghost_corner_flag(g_a,uVar11);
  if (iVar13 == 0) {
    IVar8 = (Integer)PGRP_LIST->map_proc_list[GAme];
  }
  pnga_distribution(g_a,IVar8,GA[lVar1].lo,local_1a8);
  if (GA[lVar1].num_rstrctd == 0) {
    if (0 < sVar2) goto LAB_001713eb;
    uVar11 = 1;
  }
  else {
    bVar26 = GA[lVar1].has_data == 1;
    uVar11 = (ulong)bVar26;
    if ((bVar26) && (0 < sVar2)) {
LAB_001713eb:
      uVar11 = 1;
      uVar7 = 0;
      do {
        uVar11 = uVar11 * ((local_1a8[uVar7] - GA[g_a + 1000].lo[uVar7]) + local_68[uVar7] * 2 + 1);
        uVar7 = uVar7 + 1;
      } while (ndims != uVar7);
    }
  }
  lVar24 = (long)GA[lVar1].elemsize * uVar11;
  pgVar9 = GA;
LAB_00171438:
  lVar17 = local_1b0;
  pgVar9[lVar1].id = -1;
  pgVar9[lVar1].size = lVar24;
  local_1d0 = (ulong)(lVar24 <= *(long *)((long)pgVar9->dims + local_1b0 + -0x20));
  IVar8 = pnga_type_f2c(0x3f2);
  if (iVar13 < 1) {
    pnga_gop(IVar8,&local_1d0,1,"&&");
  }
  else {
    pnga_pgroup_gop(grp_id,IVar8,&local_1d0,1,"&&");
  }
  pgVar9 = GA;
  if (local_1d0 != 0) {
    GA[lVar1].overlay = 1;
    pgVar9[lVar1].id = *(long *)((long)pgVar9->dims + lVar17 + -8);
    if (0 < local_1e0) {
      lVar24 = 0;
      do {
        GA[lVar1].ptr[lVar24] = *(char **)(*(long *)(GA->name + lVar17 + -0x10) + lVar24 * 8);
        lVar24 = lVar24 + 1;
        pgVar9 = GA;
      } while (local_1e0 != lVar24);
    }
  }
  if (((pgVar9[lVar1].distr_type == 0) && (pgVar9[lVar1].ghosts == 1)) &&
     (lVar10 = pnga_set_ghost_info(g_a), lVar10 == 0)) {
    pnga_error("Could not allocate update information for ghost cells",0);
  }
  pnga_pgroup_sync(grp_id);
  bVar26 = local_1d0 != 0;
  if (!bVar26) {
    pnga_destroy(g_a);
  }
  return (ulong)bVar26;
}

Assistant:

logical pnga_overlay(Integer g_a, Integer g_parent)
{

  Integer hi[MAXDIM];
  Integer ga_handle = g_a + GA_OFFSET;
  Integer g_p = g_parent + GA_OFFSET;
  Integer d, width[MAXDIM], ndim;
  Integer mem_size, nelem;
  Integer i, status, maplen=0, p_handle;
  Integer dims[MAXDIM], chunk[MAXDIM];
  Integer pe[MAXDIM], *pmap[MAXDIM], *map;
  Integer blk[MAXDIM];
  Integer grp_me=GAme, grp_nproc=GAnproc;
  Integer block_size = 0;

  _ga_sync_begin = 1; _ga_sync_end=1; /*remove any previous sync masking*/
  if (GA[ga_handle].ndim == -1)
    pnga_error("Insufficient data to create global array",0);

  p_handle = (Integer)GA[ga_handle].p_handle;
  if (p_handle == (Integer)GA_Init_Proc_Group) {
    GA[ga_handle].p_handle = GA_Default_Proc_Group;
    p_handle = GA_Default_Proc_Group;
  }
  pnga_pgroup_sync(p_handle);
  if (p_handle != (Integer)GA[g_p].p_handle) {
    pnga_error("Parent and overlay global array must be on same procesor group",0);
  }

  if (p_handle > 0) {
     grp_nproc  = PGRP_LIST[p_handle].map_nproc;
     grp_me = PGRP_LIST[p_handle].map_proc_list[GAme];
  }
  
  if(!GAinitialized) pnga_error("GA not initialized ", 0);
  if(!ma_address_init) gai_ma_address_init();

  ndim = GA[ga_handle].ndim;
  for (i=0; i<ndim; i++) width[i] = (C_Integer)GA[ga_handle].width[i];

  /* The data distribution has not been specified by the user. Create
     default distribution */
  if (GA[ga_handle].mapc == NULL && GA[ga_handle].distr_type == REGULAR) {
    for (d=0; d<ndim; d++) {
      dims[d] = (Integer)GA[ga_handle].dims[d];
      chunk[d] = (Integer)GA[ga_handle].chunk[d];
    }
    if(chunk[0]!=0) /* for chunk[0]=0 compute all */
      for(d=0; d< ndim; d++) blk[d]=(Integer)GA_MIN(chunk[d],dims[d]);
    else
      for(d=0; d< ndim; d++) blk[d]=-1;

    /* eliminate dimensions =1 from ddb analysis */
    for(d=0; d<ndim; d++)if(dims[d]==1)blk[d]=1;
 
    if (GAme==0 && DEBUG )
      for (d=0;d<ndim;d++) fprintf(stderr,"b[%ld]=%ld\n",(long)d,(long)blk[d]);
    pnga_pgroup_sync(p_handle);

    /* ddb(ndim, dims, GAnproc, blk, pe);*/
    if(p_handle == 0) /* for mirrored arrays */
#if OLD_DISTRIBUTION
       ddb_h2(ndim, dims, PGRP_LIST[p_handle].map_nproc,0.0,(Integer)0, blk, pe);
#else
       ddb(ndim, dims, PGRP_LIST[p_handle].map_nproc, blk, pe);
#endif
    else
       if (GA[ga_handle].num_rstrctd == 0) {
         /* Data is normally distributed on processors */
#if OLD_DISTRIBUTION
         ddb_h2(ndim, dims, grp_nproc,0.0,(Integer)0, blk, pe);
#else
         ddb(ndim, dims, grp_nproc, blk, pe);
#endif
       } else {
         /* Data is only distributed on subset of processors */
#if OLD_DISTRIBUTION
         ddb_h2(ndim, dims, GA[ga_handle].num_rstrctd, 0.0, (Integer)0, blk, pe);
#else
         ddb(ndim, dims, GA[ga_handle].num_rstrctd, blk, pe);
#endif
       }

    for(d=0, map=mapALL; d< ndim; d++){
      Integer nblock;
      Integer pcut; /* # procs that get full blk[] elements; the rest gets less*/
      int p;

      pmap[d] = map;

      /* RJH ... don't leave some nodes without data if possible
       but respect the users block size */
      
      if (chunk[d] > 1) {
        Integer ddim = ((dims[d]-1)/GA_MIN(chunk[d],dims[d]) + 1);
        pcut = (ddim -(blk[d]-1)*pe[d]) ;
      }
      else {
        pcut = (dims[d]-(blk[d]-1)*pe[d]) ;
      }

      for (nblock=i=p=0; (p<pe[d]) && (i<dims[d]); p++, nblock++) {
        Integer b = blk[d];
        if (p >= pcut)
          b = b-1;
        map[nblock] = i+1;
        if (chunk[d]>1) b *= GA_MIN(chunk[d],dims[d]);
        i += b;
      }

      pe[d] = GA_MIN(pe[d],nblock);
      map +=  pe[d]; 
    }
    if(GAme==0&& DEBUG){
      gai_print_subscript("pe ",(int)ndim, pe,"\n");
      gai_print_subscript("blocks ",(int)ndim, blk,"\n");
      printf("decomposition map\n");
      for(d=0; d< ndim; d++){
        printf("dim=%ld: ",(long)d); 
        for (i=0;i<pe[d];i++)printf("%ld ",(long)pmap[d][i]);
        printf("\n"); 
      }
      fflush(stdout);
    }
    maplen = 0;
    for( i = 0; i< ndim; i++){
      GA[ga_handle].nblock[i] = pe[i];
      maplen += pe[i];
    }
    GA[ga_handle].mapc = (C_Integer*)malloc((maplen+1)*sizeof(C_Integer*));
    for(i = 0; i< maplen; i++) {
      GA[ga_handle].mapc[i] = (C_Integer)mapALL[i];
    }
    GA[ga_handle].mapc[maplen] = -1;
  } else if (GA[ga_handle].distr_type == BLOCK_CYCLIC) {
    /* Regular block-cyclic data distribution has been specified. Figure
       out how much memory is needed by each processor to store blocks */
    Integer nblocks = GA[ga_handle].block_total;
    Integer tsize, j;
    Integer lo[MAXDIM];
    block_size = 0;
    for (i=GAme; i<nblocks; i +=GAnproc) {
      ga_ownsM(ga_handle,i,lo,hi);
      tsize = 1;
      for (j=0; j<ndim; j++) {
        tsize *= (hi[j] - lo[j] + 1);
      }
      block_size += tsize;
    }
  } else if (GA[ga_handle].distr_type == SCALAPACK) {
    /* ScaLAPACK block-cyclic data distribution has been specified. Figure
       out how much memory is needed by each processor to store blocks */
    Integer j, jtot, skip, imin, imax;
    Integer index[MAXDIM];
    gam_find_proc_indices(ga_handle,GAme,index);
    block_size = 1;
    for (i=0; i<ndim; i++) {
      skip = GA[ga_handle].nblock[i];
      jtot = 0;
      for (j=index[i]; j<GA[ga_handle].num_blocks[i]; j += skip) {
        imin = j*GA[ga_handle].block_dims[i] + 1;
        imax = (j+1)*GA[ga_handle].block_dims[i];
        if (imax > GA[ga_handle].dims[i]) imax = GA[ga_handle].dims[i];
        jtot += (imax-imin+1);
      }
      block_size *= jtot;
    }
  } else if (GA[ga_handle].distr_type == TILED) {
    /* Tiled data distribution has been specified. Figure
       out how much memory is needed by each processor to store blocks */
    Integer j, jtot, skip, imin, imax;
    Integer index[MAXDIM];
    gam_find_tile_proc_indices(ga_handle,GAme,index);
    block_size = 1;
    for (i=0; i<ndim; i++) {
      skip = GA[ga_handle].nblock[i];
      jtot = 0;
      for (j=index[i]; j<GA[ga_handle].num_blocks[i]; j += skip) {
        imin = j*GA[ga_handle].block_dims[i] + 1;
        imax = (j+1)*GA[ga_handle].block_dims[i];
        if (imax > GA[ga_handle].dims[i]) imax = GA[ga_handle].dims[i];
        jtot += (imax-imin+1);
      }
      block_size *= jtot;
    }
  } else if (GA[ga_handle].distr_type == TILED_IRREG) {
    /* Tiled data distribution has been specified. Figure
       out how much memory is needed by each processor to store blocks */
    Integer j, jtot, skip, imin, imax;
    Integer index[MAXDIM];
    Integer offset = 0;
    gam_find_tile_proc_indices(ga_handle,GAme,index);
    block_size = 1;
    for (i=0; i<ndim; i++) {
      skip = GA[ga_handle].nblock[i];
      jtot = 0;
      for (j=index[i]; j<GA[ga_handle].num_blocks[i]; j += skip) {
        imin = GA[ga_handle].mapc[offset+j];
        if (j<GA[ga_handle].num_blocks[i]-1) {
          imax = GA[ga_handle].mapc[offset+j+1]-1;
        } else {
          imax = GA[ga_handle].dims[i];
        }
        jtot += (imax-imin+1);
      }
      block_size *= jtot;
      offset += GA[ga_handle].num_blocks[i];
    }
  }

  GAstat.numcre ++;

  GA[ga_handle].actv = 1;
  /* If only one node is being used and array is mirrored,
   * set proc list to world group */
  if (pnga_cluster_nnodes() == 1 && GA[ga_handle].p_handle == 0) {
    GA[ga_handle].p_handle = pnga_pgroup_get_world();
  }

  /* Set remaining parameters and determine memory size if regular data
   * distribution is being used */
  if (GA[ga_handle].distr_type == REGULAR) {
    /* set corner flag, if it has not already been set and set up message
       passing data */
    if (GA[ga_handle].corner_flag == -1) {
       i = 1;
    } else {
       i = GA[ga_handle].corner_flag;
    }
    for( i = 0; i< ndim; i++){
       GA[ga_handle].scale[i] = (double)GA[ga_handle].nblock[i]
         / (double)GA[ga_handle].dims[i];
    }
    pnga_set_ghost_corner_flag(g_a, i);
 
    /*** determine which portion of the array I am supposed to hold ***/
    if (p_handle == 0) { /* for mirrored arrays */
       Integer me_local = (Integer)PGRP_LIST[p_handle].map_proc_list[GAme];
       pnga_distribution(g_a, me_local, GA[ga_handle].lo, hi);
    } else {
       pnga_distribution(g_a, grp_me, GA[ga_handle].lo, hi);
    }
    if (GA[ga_handle].num_rstrctd == 0 || GA[ga_handle].has_data == 1) {
      for( i = 0, nelem=1; i< ndim; i++){
        /*
        GA[ga_handle].chunk[i] = ((C_Integer)hi[i]-GA[ga_handle].lo[i]+1);
        */
        nelem *= (hi[i]-(Integer)GA[ga_handle].lo[i]+1+2*width[i]);
      }
    } else {
      nelem = 0;
    }
    mem_size = nelem * GA[ga_handle].elemsize;
  } else {
    mem_size = block_size * GA[ga_handle].elemsize;
    for( i = 0; i< ndim; i++){
       GA[ga_handle].scale[i] = (double)GA[ga_handle].num_blocks[i]
         / (double)GA[ga_handle].dims[i];
    }
  }
  GA[ga_handle].id = INVALID_MA_HANDLE;
  GA[ga_handle].size = (C_Long)mem_size;
  /* check if everybody has enough memory to fit overlay GA */
  status = (GA[ga_handle].size <= GA[g_p].size) ? 1 : 0;
  if (p_handle > 0) {
    pnga_pgroup_gop(p_handle,pnga_type_f2c(MT_F_INT), &status, 1, "&&");
  } else {
    pnga_gop(pnga_type_f2c(MT_F_INT), &status, 1, "&&");
  }

  if (status) {
    GA[ga_handle].overlay = 1;
    GA[ga_handle].id = GA[g_p].id;
    for (i=0; i<grp_nproc; i++) {
      GA[ga_handle].ptr[i] = GA[g_p].ptr[i];
    }
  }

  if (GA[ga_handle].distr_type == REGULAR) {
    /* Finish setting up information for ghost cell updates */
    if (GA[ga_handle].ghosts == 1) {
      if (!pnga_set_ghost_info(g_a))
        pnga_error("Could not allocate update information for ghost cells",0);
    }
    /* If array is mirrored, evaluate first and last indices */
    /* ngai_get_first_last_indices(&g_a); */
  }

  pnga_pgroup_sync(p_handle);
  if (status) {
    status = TRUE;
  } else {
    pnga_destroy(g_a);
    status = FALSE;
  }
  return status;
}